

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O3

void test_dt_double(void)

{
  char cVar1;
  bool bVar2;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  XSValue_Data expValue_02;
  XSValue_Data expValue_03;
  XSValue_Data expValue_04;
  XSValue_Data expValue_05;
  XSValue_Data expValue_06;
  XSValue_Data expValue_07;
  uint uVar3;
  char cVar4;
  bool bVar5;
  XSValue_Data *pXVar6;
  XSValue *pXVar7;
  wchar16 *pwVar8;
  char *pcVar9;
  long lVar10;
  uint uVar11;
  void *pvVar12;
  char *pcVar13;
  Status myStatus;
  Status myStatus_22;
  char lex_v_ran_iv_4_canrep [2];
  char lex_v_ran_iv_3_canrep [2];
  char lex_iv_2 [8];
  char lex_v_ran_iv_1_canrep [4];
  char lex_iv_1 [9];
  char lex_v_ran_iv_2_canrep [5];
  char data_canrep_4 [6];
  char data_canrep_5 [9];
  char data_canrep_2 [9];
  char data_canrep_3 [10];
  char data_canrep_1 [10];
  char data_rawstr_2 [8];
  char data_rawstr_5 [11];
  char data_rawstr_4 [11];
  char lex_v_ran_iv_4 [25];
  char lex_v_ran_iv_3 [25];
  char lex_v_ran_iv_2 [25];
  char lex_v_ran_iv_1 [25];
  char data_rawstr_3 [14];
  char data_rawstr_1 [17];
  char lex_v_ran_v_4 [25];
  char lex_v_ran_v_3 [25];
  char lex_v_ran_v_2 [25];
  char lex_v_ran_v_1 [25];
  char lex_v_ran_v_0 [17];
  StrX local_468;
  char *local_458;
  Status local_450;
  char local_44c [2];
  undefined2 local_44a;
  char local_448 [12];
  char local_43c [4];
  undefined8 local_438;
  undefined1 local_430;
  char local_428 [8];
  char local_420 [8];
  char local_418 [16];
  char local_408 [16];
  char local_3f8 [16];
  char local_3e8 [16];
  char local_3d8 [12];
  uint local_3cc;
  char local_3c8 [16];
  char local_3b8 [16];
  char local_3a8 [32];
  char local_388 [32];
  char local_368 [32];
  char local_348 [32];
  char local_328 [16];
  char local_318 [32];
  char local_2f8 [32];
  char local_2d8 [32];
  char local_2b8 [32];
  char local_298 [32];
  char local_278 [24];
  ulong local_260;
  undefined8 uStack_258;
  undefined4 local_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  ulong local_238;
  undefined8 uStack_230;
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  undefined4 uStack_218;
  undefined4 uStack_214;
  ulong local_210;
  undefined8 uStack_208;
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  ulong local_1e8;
  undefined8 uStack_1e0;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined4 local_e8;
  undefined8 local_e4;
  undefined8 uStack_dc;
  undefined4 local_d4;
  long local_d0;
  undefined8 uStack_c8;
  undefined4 local_c0;
  undefined8 local_bc;
  undefined8 uStack_b4;
  undefined4 local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  builtin_strncpy(local_278,"   1234.e+10   \n",0x11);
  builtin_strncpy(local_298 + 0x10,"158e+308",9);
  builtin_strncpy(local_298,"+1.7976931348623",0x10);
  builtin_strncpy(local_2b8 + 0x10,"158e+308",9);
  builtin_strncpy(local_2b8,"-1.7976931348623",0x10);
  builtin_strncpy(local_2d8 + 0x10,"014e-308",9);
  builtin_strncpy(local_2d8,"+2.2250738585072",0x10);
  builtin_strncpy(local_2f8 + 0x10,"014e-308",9);
  builtin_strncpy(local_2f8,"-2.2250738585072",0x10);
  builtin_strncpy(local_348 + 0x10,"158e+309",9);
  builtin_strncpy(local_348,"+1.7976931348623",0x10);
  builtin_strncpy(local_368 + 0x10,"158e+309",9);
  builtin_strncpy(local_368,"-1.7976931348623",0x10);
  builtin_strncpy(local_388 + 0x10,"014e-329",9);
  builtin_strncpy(local_388,"+2.2250738585072",0x10);
  builtin_strncpy(local_3a8 + 0x10,"014e-329",9);
  builtin_strncpy(local_3a8,"-2.2250738585072",0x10);
  builtin_strncpy(local_43c,"INF",4);
  builtin_strncpy(local_428,"-INF",5);
  local_44a = 0x30;
  local_44c[0] = '0';
  local_44c[1] = '\0';
  local_430 = 0;
  local_438 = 0x30312b652e783231;
  builtin_strncpy(local_448,"12.e+1x",8);
  builtin_strncpy(local_318,"    -123.45    \n",0x11);
  builtin_strncpy(local_3e8,"-1.2345E2",10);
  builtin_strncpy(local_3d8,"+123.45",8);
  builtin_strncpy(local_408,"1.2345E2",9);
  builtin_strncpy(local_328 + 8,"+0012",6);
  builtin_strncpy(local_328,"+123.45e",8);
  builtin_strncpy(local_3f8,"1.2345E14",10);
  builtin_strncpy(local_3b8,"+100.000e2",0xb);
  builtin_strncpy(local_420,"1.0E4",6);
  builtin_strncpy(local_3c8,"00100.23e2",0xb);
  builtin_strncpy(local_418,"1.0023E4",9);
  local_458 = (char *)((ulong)local_458 & 0xffffffff00000000);
  local_468.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_278,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_468.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_278,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar4 = xercesc_4_0::XSValue::validate
                    (local_468.fUnicodeForm,dt_double,(Status *)&local_458,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_468);
  if (cVar4 == '\0') {
    StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4ae,local_278,local_468.fLocalForm,1);
    StrX::~StrX(&local_468);
    errSeen = 1;
  }
  local_458 = (char *)((ulong)local_458 & 0xffffffff00000000);
  local_468.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_298,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_468.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_298,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar4 = xercesc_4_0::XSValue::validate
                    (local_468.fUnicodeForm,dt_double,(Status *)&local_458,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_468);
  if (cVar4 == '\0') {
    StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4af,local_298,local_468.fLocalForm,1);
    StrX::~StrX(&local_468);
    errSeen = 1;
  }
  local_458 = (char *)((ulong)local_458 & 0xffffffff00000000);
  local_468.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_2b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_468.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_2b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar4 = xercesc_4_0::XSValue::validate
                    (local_468.fUnicodeForm,dt_double,(Status *)&local_458,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_468);
  if (cVar4 == '\0') {
    StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4b0,local_2b8,local_468.fLocalForm,1);
    StrX::~StrX(&local_468);
    errSeen = 1;
  }
  local_458 = (char *)((ulong)local_458 & 0xffffffff00000000);
  local_468.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_2d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_468.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_2d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar4 = xercesc_4_0::XSValue::validate
                    (local_468.fUnicodeForm,dt_double,(Status *)&local_458,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_468);
  if (cVar4 == '\0') {
    StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4b1,local_2d8,local_468.fLocalForm,1);
    StrX::~StrX(&local_468);
    errSeen = 1;
  }
  local_458 = (char *)((ulong)local_458 & 0xffffffff00000000);
  local_468.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_2f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_468.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_2f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar4 = xercesc_4_0::XSValue::validate
                    (local_468.fUnicodeForm,dt_double,(Status *)&local_458,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_468);
  if (cVar4 == '\0') {
    StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4b2,local_2f8,local_468.fLocalForm,1);
    StrX::~StrX(&local_468);
    errSeen = 1;
  }
  local_458 = (char *)((ulong)local_458 & 0xffffffff00000000);
  local_468.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_348,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_468.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_348,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar4 = xercesc_4_0::XSValue::validate
                    (local_468.fUnicodeForm,dt_double,(Status *)&local_458,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_468);
  if (cVar4 == '\0') {
    StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4b5,local_348,local_468.fLocalForm,1);
    StrX::~StrX(&local_468);
    errSeen = 1;
  }
  local_458 = (char *)((ulong)local_458 & 0xffffffff00000000);
  local_468.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_368,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_468.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_368,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar4 = xercesc_4_0::XSValue::validate
                    (local_468.fUnicodeForm,dt_double,(Status *)&local_458,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_468);
  if (cVar4 == '\0') {
    StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4b6,local_368,local_468.fLocalForm,1);
    StrX::~StrX(&local_468);
    errSeen = 1;
  }
  local_458 = (char *)((ulong)local_458 & 0xffffffff00000000);
  local_468.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_388,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_468.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_388,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar4 = xercesc_4_0::XSValue::validate
                    (local_468.fUnicodeForm,dt_double,(Status *)&local_458,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_468);
  if (cVar4 == '\0') {
    StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4b7,local_388,local_468.fLocalForm,1);
    StrX::~StrX(&local_468);
    errSeen = 1;
  }
  local_458 = (char *)((ulong)local_458 & 0xffffffff00000000);
  local_468.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_3a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_468.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_3a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar4 = xercesc_4_0::XSValue::validate
                    (local_468.fUnicodeForm,dt_double,(Status *)&local_458,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_468);
  if (cVar4 == '\0') {
    StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4b8,local_3a8,local_468.fLocalForm,1);
    StrX::~StrX(&local_468);
    errSeen = 1;
  }
  local_458 = (char *)((ulong)local_458 & 0xffffffff00000000);
  local_468.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_438,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_468.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_438,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar4 = xercesc_4_0::XSValue::validate
                    (local_468.fUnicodeForm,dt_double,(Status *)&local_458,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_468);
  if (cVar4 == '\0') {
    if ((int)local_458 != 6) {
      StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      if (((ulong)local_458 & 0xffffffff) < 0xb) {
        pcVar13 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_458 & 0xffffffff];
      }
      else {
        pcVar13 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x4bb,&local_438,local_468.fLocalForm,"st_FOCA0002",pcVar13);
      goto LAB_00108600;
    }
  }
  else {
    StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4bb,&local_438,local_468.fLocalForm,0);
LAB_00108600:
    StrX::~StrX(&local_468);
    errSeen = 1;
  }
  local_458 = (char *)((ulong)local_458 & 0xffffffff00000000);
  local_468.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_448,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_468.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_448,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar4 = xercesc_4_0::XSValue::validate
                    (local_468.fUnicodeForm,dt_double,(Status *)&local_458,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_468);
  if (cVar4 == '\0') {
    if ((int)local_458 == 6) goto LAB_00108709;
    StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
    if (((ulong)local_458 & 0xffffffff) < 0xb) {
      pcVar13 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_458 & 0xffffffff];
    }
    else {
      pcVar13 = "st_UnknownType";
    }
    printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x4bc,local_448,local_468.fLocalForm,"st_FOCA0002",pcVar13);
  }
  else {
    StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4bc,local_448,local_468.fLocalForm,0);
  }
  StrX::~StrX(&local_468);
  errSeen = 1;
LAB_00108709:
  bVar5 = true;
  do {
    bVar2 = bVar5;
    local_458 = (char *)((ulong)local_458 & 0xffffffff00000000);
    local_468.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_278,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_468.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_278,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar12 = (void *)0x4;
    pXVar6 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_468.fUnicodeForm,dt_double,(Status *)&local_458,ver_10,bVar2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_468);
    if (pXVar6 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4da,local_278);
      StrX::~StrX(&local_468);
      errSeen = 1;
    }
    else {
      uStack_118 = 0x42a67242a2100000;
      local_100 = local_38;
      local_110 = local_48;
      uStack_108 = uStack_40;
      expValue.fValue.f_strVal = (XMLCh *)0x42a67242a2100000;
      expValue._0_8_ = local_120;
      expValue.fValue._8_8_ = local_48;
      expValue.fValue._16_8_ = uStack_40;
      expValue.fValue.f_datetime.f_milisec = (double)local_38;
      bVar5 = compareActualValue(dt_double,*pXVar6,expValue);
      if (!bVar5) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar12);
    }
    local_458 = (char *)((ulong)local_458 & 0xffffffff00000000);
    local_468.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_298,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_468.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_298,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar12 = (void *)0x4;
    pXVar6 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_468.fUnicodeForm,dt_double,(Status *)&local_458,ver_10,bVar2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_468);
    if (pXVar6 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4db,local_298);
      StrX::~StrX(&local_468);
      errSeen = 1;
    }
    else {
      uStack_140 = 0x7fefffffffffffff;
      local_128 = local_50;
      local_138 = local_60;
      uStack_130 = uStack_58;
      expValue_00.fValue.f_strVal = (XMLCh *)0x7fefffffffffffff;
      expValue_00._0_8_ = local_148;
      expValue_00.fValue._8_8_ = local_60;
      expValue_00.fValue._16_8_ = uStack_58;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_50;
      bVar5 = compareActualValue(dt_double,*pXVar6,expValue_00);
      if (!bVar5) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar12);
    }
    local_458 = (char *)((ulong)local_458 & 0xffffffff00000000);
    local_468.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_2b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_468.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_2b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar12 = (void *)0x4;
    pXVar6 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_468.fUnicodeForm,dt_double,(Status *)&local_458,ver_10,bVar2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_468);
    if (pXVar6 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4dc,local_2b8);
      StrX::~StrX(&local_468);
      errSeen = 1;
    }
    else {
      uStack_168 = 0xffefffffffffffff;
      local_150 = local_68;
      local_160 = local_78;
      uStack_158 = uStack_70;
      expValue_01.fValue.f_long = 0xffefffffffffffff;
      expValue_01._0_8_ = local_170;
      expValue_01.fValue._8_8_ = local_78;
      expValue_01.fValue._16_8_ = uStack_70;
      expValue_01.fValue.f_datetime.f_milisec = (double)local_68;
      bVar5 = compareActualValue(dt_double,*pXVar6,expValue_01);
      if (!bVar5) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar12);
    }
    local_458 = (char *)((ulong)local_458 & 0xffffffff00000000);
    local_468.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_2d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_468.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_2d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar12 = (void *)0x4;
    pXVar6 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_468.fUnicodeForm,dt_double,(Status *)&local_458,ver_10,bVar2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_468);
    if (pXVar6 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4dd,local_2d8);
      StrX::~StrX(&local_468);
      errSeen = 1;
    }
    else {
      uStack_190 = 0x10000000000000;
      local_178 = local_80;
      local_188 = local_90;
      uStack_180 = uStack_88;
      expValue_02.fValue.f_long = 0x10000000000000;
      expValue_02._0_8_ = local_198;
      expValue_02.fValue._8_8_ = local_90;
      expValue_02.fValue._16_8_ = uStack_88;
      expValue_02.fValue.f_datetime.f_milisec = (double)local_80;
      bVar5 = compareActualValue(dt_double,*pXVar6,expValue_02);
      if (!bVar5) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar12);
    }
    local_458 = (char *)((ulong)local_458 & 0xffffffff00000000);
    local_468.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_2f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_468.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_2f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar12 = (void *)0x4;
    pXVar6 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_468.fUnicodeForm,dt_double,(Status *)&local_458,ver_10,bVar2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_468);
    if (pXVar6 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4de,local_2f8);
      StrX::~StrX(&local_468);
      errSeen = 1;
    }
    else {
      uStack_1b8 = 0x8010000000000000;
      local_1a0 = local_98;
      local_1b0 = local_a8;
      uStack_1a8 = uStack_a0;
      expValue_03.fValue.f_double = -2.2250738585072014e-308;
      expValue_03._0_8_ = local_1c0;
      expValue_03.fValue._8_8_ = local_a8;
      expValue_03.fValue._16_8_ = uStack_a0;
      expValue_03.fValue.f_datetime.f_milisec = (double)local_98;
      bVar5 = compareActualValue(dt_double,*pXVar6,expValue_03);
      if (!bVar5) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar12);
    }
    local_458 = (char *)((ulong)local_458 & 0xffffffff00000000);
    local_468.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_348,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_468.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_348,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar12 = (void *)0x4;
    pXVar6 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_468.fUnicodeForm,dt_double,(Status *)&local_458,ver_10,bVar2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_468);
    if (pXVar6 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4e1,local_348);
      StrX::~StrX(&local_468);
      errSeen = 1;
    }
    else {
      uStack_1e0 = 0;
      local_1d8 = 1;
      uStack_1c4 = local_ac;
      uStack_1d4 = (undefined4)local_bc;
      uStack_1d0 = (undefined4)((ulong)local_bc >> 0x20);
      uStack_1cc = (undefined4)uStack_b4;
      uStack_1c8 = (undefined4)((ulong)uStack_b4 >> 0x20);
      expValue_04.fValue._28_4_ = local_ac;
      expValue_04.fValue._24_4_ = uStack_1c8;
      expValue_04.fValue.f_datetime.f_hour = uStack_1d4;
      expValue_04.fValue.f_datetime.f_day = 1;
      expValue_04.fValue.f_datetime.f_second = uStack_1cc;
      expValue_04.fValue.f_datetime.f_min = uStack_1d0;
      expValue_04.fValue.f_long = 0;
      expValue_04._0_8_ = local_1e8;
      bVar5 = compareActualValue(dt_double,*pXVar6,expValue_04);
      if (!bVar5) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar12);
    }
    local_458 = (char *)((ulong)local_458 & 0xffffffff00000000);
    local_468.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_368,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_468.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_368,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar12 = (void *)0x4;
    pXVar6 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_468.fUnicodeForm,dt_double,(Status *)&local_458,ver_10,bVar2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_468);
    if (pXVar6 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4e2,local_368);
      StrX::~StrX(&local_468);
      errSeen = 1;
    }
    else {
      uStack_208 = 0;
      local_200 = 0;
      uStack_1ec = local_c0;
      uStack_1fc = (undefined4)local_d0;
      uStack_1f8 = (undefined4)((ulong)local_d0 >> 0x20);
      uStack_1f4 = (undefined4)uStack_c8;
      uStack_1f0 = (undefined4)((ulong)uStack_c8 >> 0x20);
      expValue_05.fValue._28_4_ = local_c0;
      expValue_05.fValue._24_4_ = uStack_1f0;
      expValue_05.fValue.f_datetime.f_second = uStack_1f4;
      expValue_05.fValue.f_datetime.f_min = uStack_1f8;
      expValue_05.fValue.f_long = 0;
      expValue_05._0_8_ = local_210;
      expValue_05.fValue._8_8_ = local_d0 << 0x20;
      bVar5 = compareActualValue(dt_double,*pXVar6,expValue_05);
      if (!bVar5) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar12);
    }
    local_458 = (char *)((ulong)local_458 & 0xffffffff00000000);
    local_468.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_388,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_468.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_388,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar12 = (void *)0x4;
    pXVar6 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_468.fUnicodeForm,dt_double,(Status *)&local_458,ver_10,bVar2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_468);
    if (pXVar6 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4e3,local_388);
      StrX::~StrX(&local_468);
      errSeen = 1;
    }
    else {
      uStack_230 = 0;
      local_228 = 3;
      uStack_214 = local_d4;
      uStack_224 = (undefined4)local_e4;
      uStack_220 = (undefined4)((ulong)local_e4 >> 0x20);
      uStack_21c = (undefined4)uStack_dc;
      uStack_218 = (undefined4)((ulong)uStack_dc >> 0x20);
      expValue_06.fValue._28_4_ = local_d4;
      expValue_06.fValue._24_4_ = uStack_218;
      expValue_06.fValue.f_datetime.f_hour = uStack_224;
      expValue_06.fValue.f_datetime.f_day = 3;
      expValue_06.fValue.f_datetime.f_second = uStack_21c;
      expValue_06.fValue.f_datetime.f_min = uStack_220;
      expValue_06.fValue.f_long = 0;
      expValue_06._0_8_ = local_238;
      bVar5 = compareActualValue(dt_double,*pXVar6,expValue_06);
      if (!bVar5) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar12);
    }
    local_458 = (char *)((ulong)local_458 & 0xffffffff00000000);
    local_468.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_468.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar12 = (void *)0x4;
    pXVar6 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_468.fUnicodeForm,dt_double,(Status *)&local_458,ver_10,bVar2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_468);
    if (pXVar6 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4e4,local_3a8);
      StrX::~StrX(&local_468);
      errSeen = 1;
    }
    else {
      uStack_258 = 0;
      local_250 = 3;
      uStack_23c = local_e8;
      uStack_24c = (undefined4)local_f8;
      uStack_248 = (undefined4)((ulong)local_f8 >> 0x20);
      uStack_244 = (undefined4)uStack_f0;
      uStack_240 = (undefined4)((ulong)uStack_f0 >> 0x20);
      expValue_07.fValue._28_4_ = local_e8;
      expValue_07.fValue._24_4_ = uStack_240;
      expValue_07.fValue.f_datetime.f_hour = uStack_24c;
      expValue_07.fValue.f_datetime.f_day = 3;
      expValue_07.fValue.f_datetime.f_second = uStack_244;
      expValue_07.fValue.f_datetime.f_min = uStack_248;
      expValue_07.fValue.f_long = 0;
      expValue_07._0_8_ = local_260;
      bVar5 = compareActualValue(dt_double,*pXVar6,expValue_07);
      if (!bVar5) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar12);
    }
    local_458 = (char *)((ulong)local_458 & 0xffffffff00000000);
    local_468.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_438,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_468.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_438,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar7 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_468.fUnicodeForm,dt_double,(Status *)&local_458,ver_10,bVar2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_468);
    if (pXVar7 == (XSValue *)0x0) {
      if ((int)local_458 != 6) {
        StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
        pcVar13 = "st_UnknownType";
        if (((ulong)local_458 & 0xffffffff) < 0xb) {
          pcVar13 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_458 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x4e7,&local_438,local_468.fLocalForm,"st_FOCA0002",pcVar13);
        StrX::~StrX(&local_468);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      pvVar12 = (void *)0x4e7;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4e7,&local_438);
      StrX::~StrX(&local_468);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar7);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar7,pvVar12);
    }
    local_458 = (char *)((ulong)local_458 & 0xffffffff00000000);
    local_468.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_448,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_468.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_448,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar7 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_468.fUnicodeForm,dt_double,(Status *)&local_458,ver_10,bVar2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_468);
    if (pXVar7 == (XSValue *)0x0) {
      if ((int)local_458 != 6) {
        StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
        pcVar13 = "st_UnknownType";
        if (((ulong)local_458 & 0xffffffff) < 0xb) {
          pcVar13 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_458 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x4e8,local_448,local_468.fLocalForm,"st_FOCA0002",pcVar13);
        StrX::~StrX(&local_468);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      pvVar12 = (void *)0x4e8;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4e8,local_448);
      StrX::~StrX(&local_468);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar7);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar7,pvVar12);
    }
    bVar5 = false;
  } while (bVar2);
  uVar11 = 1;
  do {
    local_450 = st_Init;
    local_468.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_318,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_468.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_318,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar5 = SUB41(uVar11,0);
    local_3cc = uVar11;
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_468.fUnicodeForm,dt_double,&local_450,ver_10,bVar5,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_468);
    if (pwVar8 == (wchar16 *)0x0) {
      StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x508,local_318);
      StrX::~StrX(&local_468);
      errSeen = 1;
    }
    else {
      local_458 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_3e8;
      if (local_458 != pcVar13) {
        pcVar9 = local_458;
        if (local_458 == (char *)0x0) {
LAB_0010952b:
          if (*pcVar13 == '\0') goto LAB_0010957b;
        }
        else {
          do {
            cVar4 = *pcVar9;
            if (cVar4 == '\0') goto LAB_0010952b;
            pcVar9 = pcVar9 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar4 == cVar1);
        }
        StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x508,local_318,local_468.fLocalForm,local_458,local_3e8);
        StrX::~StrX(&local_468);
        errSeen = 1;
      }
LAB_0010957b:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar8);
      xercesc_4_0::XMLString::release(&local_458,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_450 = st_Init;
    local_468.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_468.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_468.fUnicodeForm,dt_double,&local_450,ver_10,bVar5,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_468);
    if (pwVar8 == (wchar16 *)0x0) {
      StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x509,local_3d8);
      StrX::~StrX(&local_468);
      errSeen = 1;
    }
    else {
      local_458 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_408;
      if (local_458 != pcVar13) {
        pcVar9 = local_458;
        if (local_458 == (char *)0x0) {
LAB_0010966c:
          if (*pcVar13 == '\0') goto LAB_001096bc;
        }
        else {
          do {
            cVar4 = *pcVar9;
            if (cVar4 == '\0') goto LAB_0010966c;
            pcVar9 = pcVar9 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar4 == cVar1);
        }
        StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x509,local_3d8,local_468.fLocalForm,local_458,local_408);
        StrX::~StrX(&local_468);
        errSeen = 1;
      }
LAB_001096bc:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar8);
      xercesc_4_0::XMLString::release(&local_458,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_450 = st_Init;
    local_468.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_328,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_468.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_328,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_468.fUnicodeForm,dt_double,&local_450,ver_10,bVar5,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_468);
    if (pwVar8 == (wchar16 *)0x0) {
      StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x50a,local_328);
      StrX::~StrX(&local_468);
      errSeen = 1;
    }
    else {
      local_458 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_3f8;
      if (local_458 != pcVar13) {
        pcVar9 = local_458;
        if (local_458 == (char *)0x0) {
LAB_001097ad:
          if (*pcVar13 == '\0') goto LAB_001097fd;
        }
        else {
          do {
            cVar4 = *pcVar9;
            if (cVar4 == '\0') goto LAB_001097ad;
            pcVar9 = pcVar9 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar4 == cVar1);
        }
        StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x50a,local_328,local_468.fLocalForm,local_458,local_3f8);
        StrX::~StrX(&local_468);
        errSeen = 1;
      }
LAB_001097fd:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar8);
      xercesc_4_0::XMLString::release(&local_458,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_450 = st_Init;
    local_468.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_468.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_468.fUnicodeForm,dt_double,&local_450,ver_10,bVar5,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_468);
    if (pwVar8 == (wchar16 *)0x0) {
      StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x50b,local_3b8);
      StrX::~StrX(&local_468);
      errSeen = 1;
    }
    else {
      local_458 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_420;
      if (local_458 != pcVar13) {
        pcVar9 = local_458;
        if (local_458 == (char *)0x0) {
LAB_001098ee:
          if (*pcVar13 == '\0') goto LAB_0010993e;
        }
        else {
          do {
            cVar4 = *pcVar9;
            if (cVar4 == '\0') goto LAB_001098ee;
            pcVar9 = pcVar9 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar4 == cVar1);
        }
        StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x50b,local_3b8,local_468.fLocalForm,local_458,local_420);
        StrX::~StrX(&local_468);
        errSeen = 1;
      }
LAB_0010993e:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar8);
      xercesc_4_0::XMLString::release(&local_458,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_450 = st_Init;
    local_468.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_468.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_468.fUnicodeForm,dt_double,&local_450,ver_10,bVar5,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_468);
    if (pwVar8 == (wchar16 *)0x0) {
      StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x50c,local_3c8);
      StrX::~StrX(&local_468);
      errSeen = 1;
    }
    else {
      local_458 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_418;
      if (local_458 != pcVar13) {
        pcVar9 = local_458;
        if (local_458 == (char *)0x0) {
LAB_00109a32:
          if (*pcVar13 == '\0') goto LAB_00109a82;
        }
        else {
          do {
            cVar4 = *pcVar9;
            if (cVar4 == '\0') goto LAB_00109a32;
            pcVar9 = pcVar9 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar4 == cVar1);
        }
        StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x50c,local_3c8,local_468.fLocalForm,local_458,local_418);
        StrX::~StrX(&local_468);
        errSeen = 1;
      }
LAB_00109a82:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar8);
      xercesc_4_0::XMLString::release(&local_458,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_458 = (char *)((ulong)local_458 & 0xffffffff00000000);
    local_468.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_438,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_468.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_438,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar10 = xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_468.fUnicodeForm,dt_double,(Status *)&local_458,ver_10,bVar5,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_468);
    if (lVar10 == 0) {
      if ((int)local_458 != 6) {
        StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
        pcVar13 = "st_UnknownType";
        if (((ulong)local_458 & 0xffffffff) < 0xb) {
          pcVar13 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_458 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x50f,&local_438,local_468.fLocalForm,"st_FOCA0002",pcVar13);
        StrX::~StrX(&local_468);
        goto LAB_00109ba6;
      }
    }
    else {
      StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x50f,&local_438);
      StrX::~StrX(&local_468);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar10);
LAB_00109ba6:
      errSeen = 1;
    }
    local_458 = (char *)((ulong)local_458 & 0xffffffff00000000);
    local_468.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_448,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_468.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_448,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar10 = xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_468.fUnicodeForm,dt_double,(Status *)&local_458,ver_10,bVar5,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_468);
    if (lVar10 == 0) {
      if ((int)local_458 != 6) {
        StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
        pcVar13 = "st_UnknownType";
        if (((ulong)local_458 & 0xffffffff) < 0xb) {
          pcVar13 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_458 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x510,local_448,local_468.fLocalForm,"st_FOCA0002",pcVar13);
        StrX::~StrX(&local_468);
        goto LAB_00109ca6;
      }
    }
    else {
      StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x510,local_448);
      StrX::~StrX(&local_468);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar10);
LAB_00109ca6:
      errSeen = 1;
    }
    local_450 = st_Init;
    local_468.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_348,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_468.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_348,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_468.fUnicodeForm,dt_double,&local_450,ver_10,bVar5,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_468);
    if (pwVar8 == (wchar16 *)0x0) {
      StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x513,local_348);
      StrX::~StrX(&local_468);
      errSeen = 1;
    }
    else {
      local_458 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_43c;
      if (local_458 != pcVar13) {
        pcVar9 = local_458;
        if (local_458 == (char *)0x0) {
LAB_00109d84:
          if (*pcVar13 == '\0') goto LAB_00109dd1;
        }
        else {
          do {
            cVar4 = *pcVar9;
            if (cVar4 == '\0') goto LAB_00109d84;
            pcVar9 = pcVar9 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar4 == cVar1);
        }
        StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x513,local_348,local_468.fLocalForm,local_458,local_43c);
        StrX::~StrX(&local_468);
        errSeen = 1;
      }
LAB_00109dd1:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar8);
      xercesc_4_0::XMLString::release(&local_458,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_450 = st_Init;
    local_468.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_368,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_468.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_368,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_468.fUnicodeForm,dt_double,&local_450,ver_10,bVar5,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_468);
    if (pwVar8 == (wchar16 *)0x0) {
      StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x514,local_368);
      StrX::~StrX(&local_468);
      errSeen = 1;
    }
    else {
      local_458 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_428;
      if (local_458 != pcVar13) {
        pcVar9 = local_458;
        if (local_458 == (char *)0x0) {
LAB_00109ec4:
          if (*pcVar13 == '\0') goto LAB_00109f14;
        }
        else {
          do {
            cVar4 = *pcVar9;
            if (cVar4 == '\0') goto LAB_00109ec4;
            pcVar9 = pcVar9 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar4 == cVar1);
        }
        StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x514,local_368,local_468.fLocalForm,local_458,local_428);
        StrX::~StrX(&local_468);
        errSeen = 1;
      }
LAB_00109f14:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar8);
      xercesc_4_0::XMLString::release(&local_458,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_450 = st_Init;
    local_468.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_388,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_468.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_388,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_468.fUnicodeForm,dt_double,&local_450,ver_10,bVar5,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_468);
    if (pwVar8 == (wchar16 *)0x0) {
      StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x515,local_388);
      StrX::~StrX(&local_468);
      errSeen = 1;
    }
    else {
      local_458 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = (char *)&local_44a;
      if (local_458 != pcVar13) {
        pcVar9 = local_458;
        if (local_458 == (char *)0x0) {
LAB_0010a004:
          if (*pcVar13 == '\0') goto LAB_0010a051;
        }
        else {
          do {
            cVar4 = *pcVar9;
            if (cVar4 == '\0') goto LAB_0010a004;
            pcVar9 = pcVar9 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar4 == cVar1);
        }
        StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x515,local_388,local_468.fLocalForm,local_458,&local_44a);
        StrX::~StrX(&local_468);
        errSeen = 1;
      }
LAB_0010a051:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar8);
      xercesc_4_0::XMLString::release(&local_458,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_450 = st_Init;
    local_468.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_468.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_468.fUnicodeForm,dt_double,&local_450,ver_10,bVar5,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_468);
    uVar3 = local_3cc;
    if (pwVar8 == (wchar16 *)0x0) {
      StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x516,local_3a8);
      StrX::~StrX(&local_468);
      errSeen = 1;
    }
    else {
      local_458 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_44c;
      if (local_458 != pcVar13) {
        pcVar9 = local_458;
        if (local_458 == (char *)0x0) {
LAB_0010a148:
          if (*pcVar13 == '\0') goto LAB_0010a195;
        }
        else {
          do {
            cVar4 = *pcVar9;
            if (cVar4 == '\0') goto LAB_0010a148;
            pcVar9 = pcVar9 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar4 == cVar1);
        }
        StrX::StrX(&local_468,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x516,local_3a8,local_468.fLocalForm,local_458,local_44c);
        StrX::~StrX(&local_468);
        errSeen = 1;
      }
LAB_0010a195:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar8);
      xercesc_4_0::XMLString::release(&local_458,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    uVar11 = 0;
    if ((uVar3 & 1) == 0) {
      return;
    }
  } while( true );
}

Assistant:

void test_dt_double()
{

    const XSValue::DataType dt = XSValue::dt_double;
    bool  toValidate = true;

    const char lex_v_ran_v_0[]="   1234.e+10   \n";
    const char lex_v_ran_v_1[]="+1.7976931348623158e+308";
    const char lex_v_ran_v_2[]="-1.7976931348623158e+308";
    const char lex_v_ran_v_3[]="+2.2250738585072014e-308";
    const char lex_v_ran_v_4[]="-2.2250738585072014e-308";

    XSValue::XSValue_Data act_v_ran_v_0; act_v_ran_v_0.fValue.f_double = (double)1234.e+10;
    XSValue::XSValue_Data act_v_ran_v_1; act_v_ran_v_1.fValue.f_double = (double)+1.7976931348623158e+308;
    XSValue::XSValue_Data act_v_ran_v_2; act_v_ran_v_2.fValue.f_double = (double)-1.7976931348623158e+308;
    XSValue::XSValue_Data act_v_ran_v_3; act_v_ran_v_3.fValue.f_double = (double)+2.2250738585072014e-308;
    XSValue::XSValue_Data act_v_ran_v_4; act_v_ran_v_4.fValue.f_double = (double)-2.2250738585072014e-308;

    const char lex_v_ran_iv_1[]="+1.7976931348623158e+309";
    const char lex_v_ran_iv_2[]="-1.7976931348623158e+309";
    // on linux, hp, aix, the representable range is around e-324
    // or e-325, using e-329 to gain consistent result on all
    // platforms
    const char lex_v_ran_iv_3[]="+2.2250738585072014e-329";
    const char lex_v_ran_iv_4[]="-2.2250738585072014e-329";

    const char lex_v_ran_iv_1_canrep[]="INF";  // " 1.7976931348623158E309";
    const char lex_v_ran_iv_2_canrep[]="-INF"; // "-1.7976931348623158E309";
    const char lex_v_ran_iv_3_canrep[]="0";    // "2.2250738585072014E-329";
    const char lex_v_ran_iv_4_canrep[]="0";    // "-2.2250738585072014E-329";

    XSValue::XSValue_Data lex_iv_ran_v_1; lex_iv_ran_v_1.fValue.f_double = (double)0.0;
    lex_iv_ran_v_1.fValue.f_doubleType.f_doubleEnum = XSValue::DoubleFloatType_PosINF;
    XSValue::XSValue_Data lex_iv_ran_v_2; lex_iv_ran_v_2.fValue.f_double = (double)0.0;
    lex_iv_ran_v_2.fValue.f_doubleType.f_doubleEnum = XSValue::DoubleFloatType_NegINF;
    XSValue::XSValue_Data lex_iv_ran_v_3; lex_iv_ran_v_3.fValue.f_double = (double)0.0;
    lex_iv_ran_v_3.fValue.f_doubleType.f_doubleEnum = XSValue::DoubleFloatType_Zero;
    XSValue::XSValue_Data lex_iv_ran_v_4; lex_iv_ran_v_4.fValue.f_double = (double)0.0;
    lex_iv_ran_v_4.fValue.f_doubleType.f_doubleEnum = XSValue::DoubleFloatType_Zero;

    const char lex_iv_1[]="12x.e+10";
    const char lex_iv_2[]="12.e+1x";

/***
 * 3.2.5.2 Canonical representation
 *
 * The canonical representation for float is defined by prohibiting certain options from the Lexical
 * representation (3.2.5.1).
 * Specifically,
 * 1. the exponent must be indicated by "E".
 * 2. Leading zeroes and the preceding optional "+" sign are prohibited in the exponent.
 * 3. For the mantissa, the preceding optional "+" sign is prohibited and the decimal point is required.
 *    Leading and trailing zeroes are prohibited subject to the following:
 *    number representations must be normalized such that there is a single digit to the left of the decimal point
 *    and at least a single digit to the right of the decimal point.
 *
 ***/

    const char data_rawstr_1[]="    -123.45    \n";
    const char data_canrep_1[]="-1.2345E2";
    const char data_rawstr_2[]="+123.45";
    const char data_canrep_2[]="1.2345E2";
    const char data_rawstr_3[]="+123.45e+0012";
    const char data_canrep_3[]="1.2345E14";
    const char data_rawstr_4[]="+100.000e2";
    const char data_canrep_4[]="1.0E4";
    const char data_rawstr_5[]="00100.23e2";
    const char data_canrep_5[]="1.0023E4";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid                         false           st_FOCA0002
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid, range valid
    VALIDATE_TEST(lex_v_ran_v_0 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_1 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_2 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_3 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_4 , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical valid, range invalid however XML4C converts to INF / ZERO
    VALIDATE_TEST(lex_v_ran_iv_1 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_iv_2 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_iv_3 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_iv_4 , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        // lexical valid, range valid
        ACTVALUE_TEST(lex_v_ran_v_0,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_0);
        ACTVALUE_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_v_3,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_3);
        ACTVALUE_TEST(lex_v_ran_v_4,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_4);

        // lexical valid, range invalid
        ACTVALUE_TEST(lex_v_ran_iv_1, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_iv_2, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_iv_3, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_3);
        ACTVALUE_TEST(lex_v_ran_iv_4, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_4);

        // lexical invalid
        ACTVALUE_TEST(lex_iv_1      , dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_iv_2      , dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);

    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                              0            st_FOCA0002
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                            XMLCh          n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        // lexical valid, range valid
        CANREP_TEST(data_rawstr_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,    DONT_CARE);
        CANREP_TEST(data_rawstr_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,    DONT_CARE);
        CANREP_TEST(data_rawstr_3,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_3,    DONT_CARE);
        CANREP_TEST(data_rawstr_4,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_4,    DONT_CARE);
        CANREP_TEST(data_rawstr_5,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_5,    DONT_CARE);

        // lexical invalid
        CANREP_TEST(lex_iv_1,         dt, toValidate, EXP_RET_CANREP_FALSE,  null_string,     XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2,         dt, toValidate, EXP_RET_CANREP_FALSE,  null_string,     XSValue::st_FOCA0002);

        // lexical valid, range invalid (XML4C doesn't treat as invalid)
        CANREP_TEST(lex_v_ran_iv_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_1_canrep,    DONT_CARE);
        CANREP_TEST(lex_v_ran_iv_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_2_canrep,    DONT_CARE);
        CANREP_TEST(lex_v_ran_iv_3,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_3_canrep,    DONT_CARE);
        CANREP_TEST(lex_v_ran_iv_4,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_4_canrep,    DONT_CARE);
    }
}